

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseContentInternal(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  bool bVar4;
  int iVar5;
  xmlStartTag *tag;
  int line;
  xmlChar *name;
  xmlChar *cur;
  int oldNodeNr;
  int oldSpaceNr;
  int oldNameNr;
  xmlParserCtxtPtr ctxt_local;
  
  iVar1 = ctxt->nameNr;
  iVar2 = ctxt->spaceNr;
  iVar5 = ctxt->nodeNr;
  if (((ctxt->input->flags & 0x40U) == 0) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  while( true ) {
    bVar4 = false;
    if (ctxt->input->cur < ctxt->input->end) {
      bVar4 = ctxt->disableSAX < 2;
    }
    if (!bVar4) break;
    pxVar3 = ctxt->input->cur;
    if ((*pxVar3 == '<') && (pxVar3[1] == '?')) {
      xmlParsePI(ctxt);
    }
    else if (((*ctxt->input->cur == '<') &&
             ((((ctxt->input->cur[1] == '!' && (ctxt->input->cur[2] == '[')) &&
               (ctxt->input->cur[3] == 'C')) &&
              ((ctxt->input->cur[4] == 'D' && (ctxt->input->cur[5] == 'A')))))) &&
            ((ctxt->input->cur[6] == 'T' &&
             ((ctxt->input->cur[7] == 'A' && (ctxt->input->cur[8] == '[')))))) {
      xmlParseCDSect(ctxt);
    }
    else if ((*pxVar3 == '<') &&
            (((ctxt->input->cur[1] == '!' && (ctxt->input->cur[2] == '-')) &&
             (ctxt->input->cur[3] == '-')))) {
      xmlParseComment(ctxt);
    }
    else if (*pxVar3 == '<') {
      if (ctxt->input->cur[1] == '/') {
        if (ctxt->nameNr <= iVar1) break;
        xmlParseElementEnd(ctxt);
      }
      else {
        xmlParseElementStart(ctxt);
      }
    }
    else if (*pxVar3 == '&') {
      xmlParseReference(ctxt);
    }
    else {
      xmlParseCharDataInternal(ctxt,0);
    }
    if ((ctxt->input->flags & 0x40U) == 0) {
      xmlParserShrink(ctxt);
    }
    if (((ctxt->input->flags & 0x40U) == 0) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
  }
  if (((iVar1 < ctxt->nameNr) && (ctxt->input->end <= ctxt->input->cur)) && (ctxt->wellFormed != 0))
  {
    xmlFatalErrMsgStrIntStr
              (ctxt,XML_ERR_TAG_NOT_FINISHED,"Premature end of data in tag %s line %d\n",
               ctxt->nameTab[ctxt->nameNr + -1],ctxt->pushTab[ctxt->nameNr + -1].line,(xmlChar *)0x0
              );
  }
  while (iVar5 < ctxt->nodeNr) {
    nodePop(ctxt);
  }
  while (iVar1 < ctxt->nameNr) {
    iVar5 = ctxt->nameNr + -1;
    if (ctxt->pushTab[iVar5].nsNr != 0) {
      xmlParserNsPop(ctxt,ctxt->pushTab[iVar5].nsNr);
    }
    namePop(ctxt);
  }
  while (iVar2 < ctxt->spaceNr) {
    spacePop(ctxt);
  }
  return;
}

Assistant:

static void
xmlParseContentInternal(xmlParserCtxtPtr ctxt) {
    int oldNameNr = ctxt->nameNr;
    int oldSpaceNr = ctxt->spaceNr;
    int oldNodeNr = ctxt->nodeNr;

    GROW;
    while ((ctxt->input->cur < ctxt->input->end) &&
	   (PARSER_STOPPED(ctxt) == 0)) {
	const xmlChar *cur = ctxt->input->cur;

	/*
	 * First case : a Processing Instruction.
	 */
	if ((*cur == '<') && (cur[1] == '?')) {
	    xmlParsePI(ctxt);
	}

	/*
	 * Second case : a CDSection
	 */
	/* 2.6.0 test was *cur not RAW */
	else if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
	    xmlParseCDSect(ctxt);
	}

	/*
	 * Third case :  a comment
	 */
	else if ((*cur == '<') && (NXT(1) == '!') &&
		 (NXT(2) == '-') && (NXT(3) == '-')) {
	    xmlParseComment(ctxt);
	}

	/*
	 * Fourth case :  a sub-element.
	 */
	else if (*cur == '<') {
            if (NXT(1) == '/') {
                if (ctxt->nameNr <= oldNameNr)
                    break;
	        xmlParseElementEnd(ctxt);
            } else {
	        xmlParseElementStart(ctxt);
            }
	}

	/*
	 * Fifth case : a reference. If if has not been resolved,
	 *    parsing returns it's Name, create the node
	 */

	else if (*cur == '&') {
	    xmlParseReference(ctxt);
	}

	/*
	 * Last case, text. Note that References are handled directly.
	 */
	else {
	    xmlParseCharDataInternal(ctxt, 0);
	}

	SHRINK;
	GROW;
    }

    if ((ctxt->nameNr > oldNameNr) &&
        (ctxt->input->cur >= ctxt->input->end) &&
        (ctxt->wellFormed)) {
        const xmlChar *name = ctxt->nameTab[ctxt->nameNr - 1];
        int line = ctxt->pushTab[ctxt->nameNr - 1].line;
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NOT_FINISHED,
                "Premature end of data in tag %s line %d\n",
                name, line, NULL);
    }

    /*
     * Clean up in error case
     */

    while (ctxt->nodeNr > oldNodeNr)
        nodePop(ctxt);

    while (ctxt->nameNr > oldNameNr) {
        xmlStartTag *tag = &ctxt->pushTab[ctxt->nameNr - 1];

        if (tag->nsNr != 0)
            xmlParserNsPop(ctxt, tag->nsNr);

        namePop(ctxt);
    }

    while (ctxt->spaceNr > oldSpaceNr)
        spacePop(ctxt);
}